

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

Connection __thiscall
QObject::connectImpl
          (QObject *this,QObject *sender,void **signal,QObject *receiver,void **slot,
          QSlotObjectBase *slotObjRaw,ConnectionType type,int *types,QMetaObject *senderMetaObject)

{
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> slotObjRaw_00;
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  long in_FS_OFFSET;
  int signal_index;
  QMessageLogger local_70;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> local_50;
  int *local_48;
  void **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_head_impl = slotObjRaw;
  if (signal == (void **)0x0) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_70.context.version = 2;
      local_70.context._4_8_ = 0;
      local_70.context._12_8_ = 0;
      local_70.context.function._4_4_ = 0;
      local_70.context.category = lcConnect::category.name;
      QMessageLogger::warning(&local_70,"QObject::connect: invalid nullptr parameter");
    }
    QMetaObject::Connection::Connection((Connection *)this);
  }
  else {
    local_48 = &signal_index;
    signal_index = -1;
    local_40 = signal;
    while ((senderMetaObject != (QMetaObject *)0x0 && (signal_index < 0))) {
      QMetaObject::static_metacall(senderMetaObject,IndexOfMethod,0,&local_48);
      if ((-1 < signal_index) && (signal_index < (int)(senderMetaObject->d).data[0xd]))
      goto LAB_0028f9bd;
      senderMetaObject = (senderMetaObject->d).superdata.direct;
    }
    if (senderMetaObject == (QMetaObject *)0x0) {
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        local_70.context.version = 2;
        local_70.context.function._4_4_ = 0;
        local_70.context._4_8_ = 0;
        local_70.context._12_8_ = 0;
        local_70.context.category = lcConnect::category.name;
        iVar1 = (**sender->_vptr_QObject)();
        pcVar2 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar1));
        QMessageLogger::warning(&local_70,"QObject::connect: signal not found in %s",pcVar2);
      }
      this->_vptr_QObject = (_func_int **)0x0;
    }
    else {
LAB_0028f9bd:
      iVar1 = QMetaObjectPrivate::signalOffset(senderMetaObject);
      slotObjRaw_00._M_head_impl = local_50._M_head_impl;
      signal_index = iVar1 + signal_index;
      local_50._M_head_impl = (QSlotObjectBase *)0x0;
      QObjectPrivate::connectImpl
                ((QObjectPrivate *)this,sender,signal_index,receiver,slot,slotObjRaw_00._M_head_impl
                 ,type,types,senderMetaObject);
    }
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             &local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Connection)this;
  }
  __stack_chk_fail();
}

Assistant:

QMetaObject::Connection QObject::connectImpl(const QObject *sender, void **signal,
                                             const QObject *receiver, void **slot,
                                             QtPrivate::QSlotObjectBase *slotObjRaw, Qt::ConnectionType type,
                                             const int *types, const QMetaObject *senderMetaObject)
{
    QtPrivate::SlotObjUniquePtr slotObj(slotObjRaw);
    if (!signal) {
        qCWarning(lcConnect, "QObject::connect: invalid nullptr parameter");
        return QMetaObject::Connection();
    }

    int signal_index = -1;
    void *args[] = { &signal_index, signal };
    for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
        senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
            break;
    }
    if (!senderMetaObject) {
        qCWarning(lcConnect, "QObject::connect: signal not found in %s", sender->metaObject()->className());
        return QMetaObject::Connection(nullptr);
    }
    signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    return QObjectPrivate::connectImpl(sender, signal_index, receiver, slot, slotObj.release(), type, types, senderMetaObject);
}